

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::TexSubImage2D::TexSubImage2D
          (TexSubImage2D *this,SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,GLint level,
          GLint xoffset,GLint yoffset,GLsizei width,GLsizei height,GLenum format,GLenum type,
          bool useSync,bool serverSync)

{
  bool bVar1;
  Texture *pTVar2;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_60;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_50 [2];
  undefined1 local_2a;
  undefined1 local_29;
  GLsizei local_28;
  bool serverSync_local;
  GLint GStack_24;
  bool useSync_local;
  GLsizei width_local;
  GLint yoffset_local;
  GLint xoffset_local;
  GLint level_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture_local;
  TexSubImage2D *this_local;
  
  local_29 = useSync;
  local_2a = serverSync;
  local_28 = width;
  GStack_24 = yoffset;
  width_local = xoffset;
  yoffset_local = level;
  _xoffset_local = texture;
  texture_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)this;
  Operation::Operation(&this->super_Operation,"TexSubImage2D",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__TexSubImage2D_03277698;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr(&this->m_texture,texture);
  this->m_level = yoffset_local;
  this->m_xoffset = width_local;
  this->m_yoffset = GStack_24;
  this->m_width = local_28;
  this->m_height = height;
  this->m_format = format;
  this->m_type = type;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>
            (local_50,&this->m_texture);
  Operation::modifyGLObject(&this->super_Operation,local_50);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(local_50);
  pTVar2 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
  bVar1 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)&pTVar2->sourceImage);
  if (bVar1) {
    pTVar2 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::
    SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>(&local_60,&pTVar2->sourceImage);
    Operation::modifyGLObject(&this->super_Operation,&local_60);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(&local_60);
  }
  return;
}

Assistant:

TexSubImage2D::TexSubImage2D (SharedPtr<Texture> texture, GLint level, GLint xoffset, GLint yoffset, GLsizei width, GLsizei height, GLenum format, GLenum type, bool useSync, bool serverSync)
	: Operation		("TexSubImage2D", useSync, serverSync)
	, m_texture		(texture)
	, m_level		(level)
	, m_xoffset		(xoffset)
	, m_yoffset		(yoffset)
	, m_width		(width)
	, m_height		(height)
	, m_format		(format)
	, m_type		(type)
{
	modifyGLObject(SharedPtr<Object>(m_texture));

	if (m_texture->sourceImage)
		modifyGLObject(SharedPtr<Object>(m_texture->sourceImage));
}